

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

Error __thiscall asmjit::BaseCompiler::onAttach(BaseCompiler *this,CodeHolder *code)

{
  Error EVar1;
  uint uVar2;
  uint32_t uVar3;
  Error EVar4;
  
  EVar1 = BaseBuilder::onAttach(&this->super_BaseBuilder,code);
  if (EVar1 == 0) {
    uVar2 = (uint)(code->_environment)._arch;
    uVar3 = ArchTraits::regTypeToSignature
                      ((ArchTraits *)(_archTraits + (ulong)(uVar2 & 0x7f) * 0xd4),6 - (uVar2 & 1));
    (this->super_BaseBuilder).super_BaseEmitter._gpRegInfo._signature = uVar3;
    EVar4 = BaseBuilder::addPassT<asmjit::GlobalConstPoolPass>(&this->super_BaseBuilder);
    EVar1 = 0;
    if (EVar4 != 0) {
      (*(this->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[0x11])(this,code);
      EVar1 = EVar4;
    }
  }
  return EVar1;
}

Assistant:

Error BaseCompiler::onAttach(CodeHolder* code) noexcept {
  ASMJIT_PROPAGATE(Base::onAttach(code));

  const ArchTraits& archTraits = ArchTraits::byArch(code->arch());
  uint32_t nativeRegType = Environment::is32Bit(code->arch()) ? BaseReg::kTypeGp32 : BaseReg::kTypeGp64;
  _gpRegInfo.setSignature(archTraits.regTypeToSignature(nativeRegType));

  Error err = addPassT<GlobalConstPoolPass>();
  if (ASMJIT_UNLIKELY(err)) {
    onDetach(code);
    return err;
  }

  return kErrorOk;
}